

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

bool __thiscall gl4cts::DirectStateAccess::Framebuffers::BlitTest::CheckDepth(BlitTest *this)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GLfloat (*paGVar2) [3];
  MessageBuilder *pMVar3;
  long lVar4;
  GLfloat (*paGVar5) [3];
  ulong uVar6;
  float fVar7;
  float fVar8;
  GLfloat depth [2] [3];
  undefined1 local_1a0 [384];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  paGVar5 = depth;
  depth[0][0] = 0.0;
  depth[0][1] = 0.0;
  depth[0][2] = 0.0;
  depth[1][0] = 0.0;
  depth[1][1] = 0.0;
  depth[1][2] = 0.0;
  uVar6 = 0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1220))(0,0,3,2,0x1902,0x1406,paGVar5);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glReadPixels has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xb96);
  paGVar2 = CheckDepth::reference;
  do {
    if (uVar6 == 2) {
LAB_00b0460f:
      return 1 < uVar6;
    }
    lVar4 = 0;
    while (lVar4 != 3) {
      fVar7 = (*paGVar2)[lVar4] - (*paGVar5)[lVar4];
      fVar8 = -fVar7;
      if (-fVar7 <= fVar7) {
        fVar8 = fVar7;
      }
      lVar4 = lVar4 + 1;
      if (0.015625 < fVar8) {
        local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        this_00 = (ostringstream *)(local_1a0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"Blitted framebuffer depth buffer contains [");
        std::ostream::operator<<(this_00,depth[0][0]);
        std::operator<<((ostream *)this_00,", ");
        std::ostream::operator<<(this_00,depth[0][1]);
        std::operator<<((ostream *)this_00,", ");
        std::ostream::operator<<(this_00,depth[0][2]);
        std::operator<<((ostream *)this_00,", \n");
        std::ostream::operator<<(this_00,depth[1][0]);
        std::operator<<((ostream *)this_00,", ");
        std::ostream::operator<<(this_00,depth[1][1]);
        std::operator<<((ostream *)this_00,", ");
        std::ostream::operator<<(this_00,depth[1][2]);
        std::operator<<((ostream *)this_00,"], but ");
        pMVar3 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1a0,CheckDepth::reference[0]);
        std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckDepth::reference[0] + 1);
        std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckDepth::reference[0] + 2);
        std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", \n");
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckDepth::reference[1]);
        std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckDepth::reference[1] + 1);
        std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckDepth::reference[1] + 2);
        std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                        "] was expected.");
        tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        goto LAB_00b0460f;
      }
    }
    uVar6 = uVar6 + 1;
    paGVar2 = paGVar2 + 1;
    paGVar5 = paGVar5 + 1;
  } while( true );
}

Assistant:

bool BlitTest::CheckDepth()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reference values. */
	static const glw::GLfloat reference[2][3] = { { 0.5, 0.25, 0.125 }, { 0.0625, 0.0625, 0.0625 } };

	/* Copy buffer. */
	glw::GLfloat depth[2][3] = { { 0 } };

	/* Reading from GL. */
	gl.readPixels(0, 0, 3, 2, GL_DEPTH_COMPONENT, GL_FLOAT, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

	/* Comparison against the reference. */
	for (glw::GLuint j = 0; j < 2; ++j)
	{
		for (glw::GLuint i = 0; i < 3; ++i)
		{
			if (de::abs(reference[j][i] - depth[j][i]) > (1.f / 64.f) /* Precision. */)
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Blitted framebuffer depth buffer contains [" << depth[0][0] << ", "
					<< depth[0][1] << ", " << depth[0][2] << ", \n"
					<< depth[1][0] << ", " << depth[1][1] << ", " << depth[1][2] << "], but " << reference[0][0] << ", "
					<< reference[0][1] << ", " << reference[0][2] << ", \n"
					<< reference[1][0] << ", " << reference[1][1] << ", " << reference[1][2] << "] was expected."
					<< tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	return true;
}